

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetSigningProvider
          (DescriptorScriptPubKeyMan *this,CPubKey *pubkey)

{
  long lVar1;
  const_iterator cVar2;
  key_type *in_RDX;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock69;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock69,(AnnotatedMixin<std::recursive_mutex> *)(pubkey[9].vch + 7),
             "cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x97e,false);
  cVar2 = std::
          _Rb_tree<CPubKey,_std::pair<const_CPubKey,_int>,_std::_Select1st<std::pair<const_CPubKey,_int>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
          ::find((_Rb_tree<CPubKey,_std::pair<const_CPubKey,_int>,_std::_Select1st<std::pair<const_CPubKey,_int>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                  *)(pubkey[2].vch + 6),in_RDX);
  if (cVar2._M_node == (_Base_ptr)(pubkey[2].vch + 0xe)) {
    (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
  }
  else {
    GetSigningProvider(this,(int32_t)pubkey,SUB41(*(undefined4 *)&cVar2._M_node[3].field_0x4,0));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock69.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
            )(__uniq_ptr_data<FlatSigningProvider,_std::default_delete<FlatSigningProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<FlatSigningProvider> DescriptorScriptPubKeyMan::GetSigningProvider(const CPubKey& pubkey) const
{
    LOCK(cs_desc_man);

    // Find index of the pubkey
    auto it = m_map_pubkeys.find(pubkey);
    if (it == m_map_pubkeys.end()) {
        return nullptr;
    }
    int32_t index = it->second;

    // Always try to get the signing provider with private keys. This function should only be called during signing anyways
    return GetSigningProvider(index, true);
}